

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_Table.cc
# Opt level: O0

void __thiscall MyDB_Table::MyDB_Table(MyDB_Table *this,string *name,string *storageLocIn)

{
  string *storageLocIn_local;
  string *name_local;
  MyDB_Table *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->storageLoc);
  std::__cxx11::string::operator=((string *)this,(string *)name);
  std::__cxx11::string::operator=((string *)&this->storageLoc,(string *)storageLocIn);
  return;
}

Assistant:

MyDB_Table :: MyDB_Table (string name, string storageLocIn) {
	tableName = name;
	storageLoc = storageLocIn;
}